

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QString * __thiscall
QUrl::authority(QString *__return_storage_ptr__,QUrl *this,ComponentFormattingOptions options)

{
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (this->d != (QUrlPrivate *)0x0) {
    if ((QFlagsStorage<QUrl::ComponentFormattingOption>)
        options.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
        super_QFlagsStorage<QUrl::ComponentFormattingOption>.i ==
        (QFlagsStorage<QUrl::ComponentFormattingOption>)0x7f00000) {
      local_38.context.version = 2;
      local_38.context.function._4_4_ = 0;
      local_38.context._4_8_ = 0;
      local_38.context._12_8_ = 0;
      local_38.context.category = "default";
      QMessageLogger::warning
                (&local_38,"QUrl::authority(): QUrl::FullyDecoded is not permitted in this function"
                );
    }
    else {
      QUrlPrivate::appendAuthority
                (this->d,__return_storage_ptr__,
                 (FormattingOptions)
                 options.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
                 super_QFlagsStorage<QUrl::ComponentFormattingOption>.i,Authority);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::authority(ComponentFormattingOptions options) const
{
    QString result;
    if (!d)
        return result;

    if (options == QUrl::FullyDecoded) {
        qWarning("QUrl::authority(): QUrl::FullyDecoded is not permitted in this function");
        return result;
    }

    d->appendAuthority(result, options, QUrlPrivate::Authority);
    return result;
}